

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_can_test.cpp
# Opt level: O3

void __thiscall SocketCAN::Socket::Socket(Socket *this,char *ifc)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  sockaddr local_38;
  undefined8 local_28;
  
  iVar1 = socket(0x1d,3,1);
  this->_fd = iVar1;
  if (iVar1 < 0) {
    perror("Error while opening socket");
    return;
  }
  local_38.sa_data._2_4_ = if_nametoindex(ifc);
  if (local_38.sa_data._2_4_ != 0) {
    local_38.sa_data[6] = '\0';
    local_38.sa_data[7] = '\0';
    local_38.sa_data[8] = '\0';
    local_38.sa_data[9] = '\0';
    local_38.sa_data[10] = '\0';
    local_38.sa_data[0xb] = '\0';
    local_38.sa_data[0xc] = '\0';
    local_38.sa_data[0xd] = '\0';
    local_28 = 0;
    local_38._0_4_ = 0x1d;
    iVar1 = bind(this->_fd,&local_38,0x18);
    if (iVar1 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to bind to the can socket: ",0x22);
      if (ifc == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107168);
      }
      else {
        sVar2 = strlen(ifc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,ifc,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": error",7);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107168);
      }
      else {
        sVar2 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      close(this->_fd);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Failed to get the SocketCAN interface index: ",0x2d);
  if (ifc == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107168);
  }
  else {
    sVar2 = strlen(ifc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,ifc,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": error",7);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107168);
  }
  else {
    sVar2 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  close(this->_fd);
  return;
}

Assistant:

Socket(const char* ifc) {

    if((_fd = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
      perror("Error while opening socket");
      return;
    }

    auto ifindx = if_nametoindex(ifc);
    if (ifindx <= 0) {
      std::cerr << "Failed to get the SocketCAN interface index: "
                << ifc << ": error" << strerror(errno) << std::endl;

      close(_fd);
      return;
    }

    struct sockaddr_can addr{0};

    addr.can_family  = AF_CAN;
    addr.can_ifindex = static_cast<int>(ifindx);

    if(bind(_fd, reinterpret_cast<struct sockaddr *>(&addr), sizeof(addr)) < 0) {
      std::cerr << "Failed to bind to the can socket: "
                << ifc << ": error" << strerror(errno) << std::endl;

      close(_fd);
      return;
    }

  }